

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::BaseBuilder::_newConstPoolNode(BaseBuilder *this,ConstPoolNode **out)

{
  Error EVar1;
  ConstPoolNode *node;
  BaseBuilder *unaff_RBX;
  ConstPoolNode **unaff_R14;
  size_t local_20;
  
  *out = (ConstPoolNode *)0x0;
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newConstPoolNode();
  }
  else {
    node = (ConstPoolNode *)ZoneAllocator::_alloc(&this->_allocator,0x118,&local_20);
    unaff_RBX = this;
    unaff_R14 = out;
    if (node != (ConstPoolNode *)0x0) {
      (node->super_LabelNode).super_BaseNode.field_0.field_0._prev = (BaseNode *)0x0;
      (node->super_LabelNode).super_BaseNode.field_0.field_0._next = (BaseNode *)0x0;
      (node->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\x03';
      (node->super_LabelNode).super_BaseNode.field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x50
      ;
      *(undefined8 *)((long)&(node->super_LabelNode).super_BaseNode.field_1 + 2) = 0;
      *(undefined8 *)((long)&(node->super_LabelNode).super_BaseNode.field_3 + 2) = 0;
      *(undefined8 *)((long)&(node->super_LabelNode).super_BaseNode._passData + 2) = 0;
      *(undefined8 *)((long)&(node->super_LabelNode).super_BaseNode._inlineComment + 2) = 0;
      *(undefined2 *)((long)&(node->super_LabelNode)._labelId + 2) = 0;
      ConstPool::ConstPool(&node->_constPool,&this->_codeZone);
      (node->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\b';
      (node->super_LabelNode).super_BaseNode.field_1._any._nodeFlags =
           (node->super_LabelNode).super_BaseNode.field_1._any._nodeFlags & 0xec | 2;
      *out = node;
      goto LAB_0011221b;
    }
  }
  *unaff_R14 = (ConstPoolNode *)0x0;
  EVar1 = BaseEmitter::reportError(&unaff_RBX->super_BaseEmitter,1,(char *)0x0);
  if (EVar1 != 0) {
    return EVar1;
  }
  node = *unaff_R14;
LAB_0011221b:
  EVar1 = registerLabelNode(unaff_RBX,&node->super_LabelNode);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newConstPoolNode(ConstPoolNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<ConstPoolNode>(out));
  return registerLabelNode(*out);
}